

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O3

void out_common(char *file,int line,char *func,int level,char *suffix,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  char *pcVar7;
  char local_20c8 [8];
  char buf [8192];
  char errstr [128];
  
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  buf[0x1ff8] = '\0';
  buf[0x1ff9] = '\0';
  buf[0x1ffa] = '\0';
  buf[0x1ffb] = '\0';
  buf[0x1ffc] = '\0';
  buf[0x1ffd] = '\0';
  buf[0x1ffe] = '\0';
  buf[0x1fff] = '\0';
  if (file == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    pcVar6 = strrchr(file,0x2f);
    pcVar7 = pcVar6 + 1;
    if (pcVar6 == (char *)0x0) {
      pcVar7 = file;
    }
    uVar3 = out_snprintf(local_20c8,0x2000,"<%s>: <%d> [%s:%d %s] ",Log_prefix,(ulong)(uint)level,
                         pcVar7,(ulong)(uint)line,func);
    uVar2 = Log_alignment;
    if ((int)uVar3 < 0) {
      fputs("out_snprintf failed",(FILE *)Out_fp);
      goto LAB_00102ad4;
    }
    if (uVar3 <= Log_alignment && Log_alignment - uVar3 != 0) {
      memset(local_20c8 + uVar3,0x20,(ulong)(Log_alignment - uVar3));
      uVar3 = uVar2;
    }
  }
  if (fmt == (char *)0x0) {
    pcVar7 = "";
LAB_00102a66:
    out_snprintf(local_20c8 + uVar3,(ulong)(0x2000 - uVar3),"%s%s%s",pcVar7,buf + 0x1ff8,suffix);
    pcVar7 = local_20c8;
  }
  else {
    if (*fmt == '!') {
      fmt = fmt + 1;
      util_strerror(*piVar5,buf + 0x1ff8,0x80);
      pcVar7 = ": ";
    }
    else {
      pcVar7 = "";
    }
    iVar4 = vsnprintf(local_20c8 + uVar3,(ulong)(0x2000 - uVar3),fmt,ap);
    if (-1 < iVar4) {
      uVar3 = uVar3 + iVar4;
      goto LAB_00102a66;
    }
    pcVar7 = "Vsnprintf failed";
  }
  fputs(pcVar7,(FILE *)Out_fp);
LAB_00102ad4:
  *piVar5 = iVar1;
  return;
}

Assistant:

static void
out_common(const char *file, int line, const char *func, int level,
		const char *suffix, const char *fmt, va_list ap)
{
	int oerrno = errno;
	char buf[MAXPRINT];
	unsigned cc = 0;
	int ret;
	const char *sep = "";
	char errstr[UTIL_MAX_ERR_MSG] = "";

	if (file) {
		char *f = strrchr(file, OS_DIR_SEPARATOR);
		if (f)
			file = f + 1;
		ret = out_snprintf(&buf[cc], MAXPRINT - cc,
				"<%s>: <%d> [%s:%d %s] ",
				Log_prefix, level, file, line, func);
		if (ret < 0) {
			Print("out_snprintf failed");
			goto end;
		}
		cc += (unsigned)ret;
		if (cc < Log_alignment) {
			memset(buf + cc, ' ', Log_alignment - cc);
			cc = Log_alignment;
		}
	}

	if (fmt) {
		if (*fmt == '!') {
			fmt++;
			sep = ": ";
			util_strerror(errno, errstr, UTIL_MAX_ERR_MSG);
		}
		ret = Vsnprintf(&buf[cc], MAXPRINT - cc, fmt, ap);
		if (ret < 0) {
			Print("Vsnprintf failed");
			goto end;
		}
		cc += (unsigned)ret;
	}

	out_snprintf(&buf[cc], MAXPRINT - cc, "%s%s%s", sep, errstr, suffix);

	Print(buf);

end:
	errno = oerrno;
}